

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
* __thiscall
rangeless::fn::impl::
group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::
gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
::operator()(maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
             *__return_storage_ptr__,
            gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
            *this)

{
  seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
  sStack_48;
  
  if ((this->current).m_empty == false) {
    while (this->reached_subend == false) {
      next((gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
            *)&stack0xffffffffffffffd0);
      maybe<rangeless::fn::impl::X>::reset
                ((maybe<rangeless::fn::impl::X> *)&stack0xffffffffffffffd0);
    }
  }
  else {
    to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>::
    operator()((gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_> *
               )&stack0xffffffffffffffd8);
    maybe<rangeless::fn::impl::X>::operator=
              (&this->current,(maybe<rangeless::fn::impl::X> *)&stack0xffffffffffffffd8);
    maybe<rangeless::fn::impl::X>::reset((maybe<rangeless::fn::impl::X> *)&stack0xffffffffffffffd8);
  }
  if ((this->current).m_empty == true) {
    __return_storage_ptr__->m_empty = true;
  }
  else {
    this->reached_subend = false;
    sStack_48.m_current.m_empty = true;
    sStack_48.m_started = false;
    sStack_48.m_ended = false;
    sStack_48.m_resumable = false;
    sStack_48.m_gen.parent = this;
    maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
    ::maybe(__return_storage_ptr__,&sStack_48);
    maybe<rangeless::fn::impl::X>::reset(&sStack_48.m_current);
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<value_type> operator()() // return seq for next group
            {
                if(!current) { // starting initial group
                    current = in_gen();
                } else {

                    // NB: the user-code may have accessed the group only
                    // partially (or not at all), in which case we must skip
                    // over the rest elements in the group until we reach 
                    // the next one.
                    while(!reached_subend) {
                        next();
                    }
                }

                if(!current) { // reached final end
                    return {};
                }

                reached_subend = false;
                return { subgen{ this } };
            }